

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLdimacs.c
# Opt level: O2

void RDL_dimacsGraph_delete(RDL_DimacsGraph *graph)

{
  if (graph->cycles != (RDL_cycle **)0x0) {
    RDL_deleteCycles(graph->cycles,graph->nof_cycles);
  }
  if (graph->sorted_cycles != (char **)0x0) {
    RDL_deleteEdgeIdxArray(graph->sorted_cycles,graph->nof_cycles);
  }
  free(graph->edges);
  free(graph->name);
  free(graph);
  return;
}

Assistant:

void RDL_dimacsGraph_delete(RDL_DimacsGraph* graph)
{
  if (graph->cycles) {
    RDL_deleteCycles(graph->cycles, graph->nof_cycles);
  }
  if (graph->sorted_cycles) {
    RDL_deleteEdgeIdxArray(graph->sorted_cycles, graph->nof_cycles);
  }
  if (graph->edges) {
    free(graph->edges);
  }
  if (graph->name) {
    free(graph->name);
  }
  free(graph);
}